

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

uint LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = (int)pIn;
  do {
    if (pInLimit + -7 <= pIn) {
      if ((pIn < pInLimit + -3) && ((int)*(ulong *)pMatch == (int)*(ulong *)pIn)) {
        pIn = (BYTE *)((long)pIn + 4);
        pMatch = (BYTE *)((long)pMatch + 4);
      }
      if ((pIn < pInLimit + -1) && ((short)*(ulong *)pMatch == (short)*(ulong *)pIn)) {
        pIn = (BYTE *)((long)pIn + 2);
        pMatch = (BYTE *)((long)pMatch + 2);
      }
      if (pIn < pInLimit) {
        pIn = (BYTE *)((long)pIn + (ulong)((char)*(ulong *)pMatch == (char)*(ulong *)pIn));
      }
      return (int)pIn - iVar5;
    }
    uVar1 = *(ulong *)pMatch;
    uVar2 = *(ulong *)pIn;
    uVar6 = uVar2 ^ uVar1;
    uVar3 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    iVar4 = (int)pIn;
    pIn = (BYTE *)((long)pIn + 8);
    pMatch = (BYTE *)((long)pMatch + 8);
  } while (uVar1 == uVar2);
  return (((uint)(uVar3 >> 3) & 0x1fffffff) + iVar4) - iVar5;
}

Assistant:

static unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    while (likely(pIn<pInLimit-(STEPSIZE-1)))
    {
        size_t diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if (LZ4_64bits()) if ((pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}